

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.hpp
# Opt level: O0

size_t __thiscall pg::bitset::find_prev(bitset *this,size_t pos)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  uint64_t m;
  size_t i;
  size_t pos_local;
  bitset *this_local;
  
  if ((pos == 0) || (pos == 0xffffffffffffffff)) {
    this_local = (bitset *)0xffffffffffffffff;
  }
  else {
    m = block_index(this,pos);
    uVar3 = this->_bits[m];
    sVar2 = bit_index(this,pos);
    uVar3 = uVar3 & (-1L << ((byte)sVar2 & 0x3f) ^ 0xffffffffffffffffU);
    if (uVar3 == 0) {
      if (m == 0) {
        this_local = (bitset *)0xffffffffffffffff;
      }
      else {
        do {
          m = m - 1;
          if (this->_bits[m] != 0) {
            iVar1 = bsr(this->_bits[m]);
            return m * 0x40 + (long)iVar1;
          }
        } while (m != 0);
        this_local = (bitset *)0xffffffffffffffff;
      }
    }
    else {
      iVar1 = bsr(uVar3);
      this_local = (bitset *)(m * 0x40 + (long)iVar1);
    }
  }
  return (size_t)this_local;
}

Assistant:

size_t find_prev(size_t pos) const
    {
        if (pos == 0 or pos == npos) return npos;
        size_t i = block_index(pos);
        uint64_t m = _bits[i] & ~((~uint64_t(0)) << (int)bit_index(pos));
        if (m) {
            return i*64 + bsr(m);
        } else {
            if (i == 0) return npos;
            i -= 1;
            for (;;) {
                if (_bits[i] != 0) return i*64 + bsr(_bits[i]);
                if (i == 0) return npos;
                i--;
            }
        }
    }